

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cpp
# Opt level: O0

Style * __thiscall
ccs::Dumper::edgeStyle_abi_cxx11_(Style *__return_storage_ptr__,Dumper *this,Key *key)

{
  mapped_type *pmVar1;
  allocator local_219;
  key_type local_218;
  allocator local_1f1;
  key_type local_1f0;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream str;
  Key *key_local;
  Dumper *this_local;
  Style *style;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  ccs::operator<<((ostream *)local_1a0,key);
  std::__cxx11::ostringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"label",&local_1f1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_1f0);
  std::__cxx11::string::operator=((string *)pmVar1,local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"fontsize",&local_219);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_218);
  std::__cxx11::string::operator=((string *)pmVar1,"9");
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

Style Dumper::edgeStyle(const Key &key) const {
  Style style;
  std::ostringstream str;
  str << key;
  style["label"] = str.str();
  style["fontsize"] = "9";
  return style;
}